

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilder::AddElement<int>
          (FlatBufferBuilder *this,voffset_t field,int e,int def)

{
  int *piVar1;
  int litle_endian_element;
  
  if ((e == def) && (this->force_defaults_ != true)) {
    return;
  }
  Align(this,4);
  piVar1 = (int *)vector_downward::make_space(&this->buf_,4);
  *piVar1 = e;
  TrackField(this,field,
             ((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) + *(int *)&(this->buf_).buf_
            );
  return;
}

Assistant:

void AddElement(voffset_t field, T e, T def) {
    // We don't serialize values equal to the default.
    if (e == def && !force_defaults_) return;
    auto off = PushElement(e);
    TrackField(field, off);
  }